

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseCharRef(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar *pxVar2;
  xmlParserInputPtr pxVar3;
  char *msg;
  int iVar4;
  xmlParserErrors error;
  uint val;
  
  pxVar3 = ctxt->input;
  pxVar2 = pxVar3->cur;
  if (*pxVar2 == '&') {
    if ((pxVar2[1] == '#') && (pxVar2[2] == 'x')) {
      pxVar3->cur = pxVar2 + 3;
      pxVar3->col = pxVar3->col + 3;
      if (pxVar2[3] == '\0') {
        xmlParserInputGrow(pxVar3,0xfa);
      }
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      pxVar3 = ctxt->input;
      pxVar2 = pxVar3->cur;
      val = 0;
      if (*pxVar2 != ';') {
        iVar4 = 0;
        val = 0;
        do {
          if (iVar4 < 0x15) {
            iVar4 = iVar4 + 1;
          }
          else {
            if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar2 < 0xfa)) {
              xmlGROW(ctxt);
            }
            iVar4 = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
              return 0;
            }
          }
          bVar1 = *ctxt->input->cur;
          if (9 < (byte)(bVar1 - 0x30)) {
            if ((0x60 < bVar1) && (iVar4 < 0x14 && bVar1 < 0x67)) {
              val = (val * 0x10 + (uint)bVar1) - 0x57;
              goto LAB_0015a048;
            }
            if (((0x40 < bVar1) && (bVar1 < 0x47)) && (iVar4 < 0x14)) {
              val = (val * 0x10 + (uint)bVar1) - 0x37;
              goto LAB_0015a048;
            }
            error = XML_ERR_INVALID_HEX_CHARREF;
LAB_0015a21d:
            val = 0;
            xmlFatalErr(ctxt,error,(char *)0x0);
            break;
          }
          val = (val * 0x10 + (uint)bVar1) - 0x30;
LAB_0015a048:
          if (0x10ffff < (int)val) {
            val = 0x110000;
          }
          xmlNextChar(ctxt);
          iVar4 = iVar4 + 1;
          pxVar3 = ctxt->input;
          pxVar2 = pxVar3->cur;
        } while (*pxVar2 != ';');
      }
    }
    else {
      if (pxVar2[1] != '#') goto LAB_0015a168;
      pxVar3->cur = pxVar2 + 2;
      pxVar3->col = pxVar3->col + 2;
      if (pxVar2[2] == '\0') {
        xmlParserInputGrow(pxVar3,0xfa);
      }
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      pxVar3 = ctxt->input;
      pxVar2 = pxVar3->cur;
      val = 0;
      if (*pxVar2 != ';') {
        iVar4 = 0;
        val = 0;
        do {
          if (iVar4 < 0x15) {
            iVar4 = iVar4 + 1;
          }
          else {
            if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar2 < 0xfa)) {
              xmlGROW(ctxt);
            }
            iVar4 = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
              return 0;
            }
          }
          bVar1 = *ctxt->input->cur;
          if (9 < (byte)(bVar1 - 0x30)) {
            error = XML_ERR_INVALID_DEC_CHARREF;
            goto LAB_0015a21d;
          }
          val = ((uint)bVar1 + val * 10) - 0x30;
          if (0x10ffff < (int)val) {
            val = 0x110000;
          }
          xmlNextChar(ctxt);
          iVar4 = iVar4 + 1;
          pxVar3 = ctxt->input;
          pxVar2 = pxVar3->cur;
        } while (*pxVar2 != ';');
      }
    }
    pxVar3 = ctxt->input;
    if (*pxVar3->cur == ';') {
      pxVar3->col = pxVar3->col + 1;
      pxVar3->cur = pxVar3->cur + 1;
    }
  }
  else {
LAB_0015a168:
    val = 0;
    xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
  }
  if ((int)val < 0x110000) {
    if ((int)val < 0x100) {
      if (0x1f < (int)val) {
        return val;
      }
      msg = "xmlParseCharRef: invalid xmlChar value %d\n";
      if ((val < 0xe) && ((0x2600U >> (val & 0x1f) & 1) != 0)) {
        return val;
      }
    }
    else {
      if (val - 0x10000 < 0xffffd800 || val - 0xe000 < 0x1ffe) {
        return val;
      }
      msg = "xmlParseCharRef: invalid xmlChar value %d\n";
    }
  }
  else {
    msg = "xmlParseCharRef: character reference out of bounds\n";
  }
  xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,msg,val);
  return 0;
}

Assistant:

int
xmlParseCharRef(xmlParserCtxtPtr ctxt) {
    int val = 0;
    int count = 0;

    /*
     * Using RAW/CUR/NEXT is okay since we are working on ASCII range here
     */
    if ((RAW == '&') && (NXT(1) == '#') &&
        (NXT(2) == 'x')) {
	SKIP(3);
	GROW;
	while (RAW != ';') { /* loop blocked by count */
	    if (count++ > 20) {
		count = 0;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(0);
	    }
	    if ((RAW >= '0') && (RAW <= '9'))
	        val = val * 16 + (CUR - '0');
	    else if ((RAW >= 'a') && (RAW <= 'f') && (count < 20))
	        val = val * 16 + (CUR - 'a') + 10;
	    else if ((RAW >= 'A') && (RAW <= 'F') && (count < 20))
	        val = val * 16 + (CUR - 'A') + 10;
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_HEX_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    NEXT;
	    count++;
	}
	if (RAW == ';') {
	    /* on purpose to avoid reentrancy problems with NEXT and SKIP */
	    ctxt->input->col++;
	    ctxt->input->cur++;
	}
    } else if  ((RAW == '&') && (NXT(1) == '#')) {
	SKIP(2);
	GROW;
	while (RAW != ';') { /* loop blocked by count */
	    if (count++ > 20) {
		count = 0;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(0);
	    }
	    if ((RAW >= '0') && (RAW <= '9'))
	        val = val * 10 + (CUR - '0');
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_DEC_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    NEXT;
	    count++;
	}
	if (RAW == ';') {
	    /* on purpose to avoid reentrancy problems with NEXT and SKIP */
	    ctxt->input->col++;
	    ctxt->input->cur++;
	}
    } else {
        xmlFatalErr(ctxt, XML_ERR_INVALID_CHARREF, NULL);
    }

    /*
     * [ WFC: Legal Character ]
     * Characters referred to using character references must match the
     * production for Char.
     */
    if (val >= 0x110000) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                "xmlParseCharRef: character reference out of bounds\n",
	        val);
    } else if (IS_CHAR(val)) {
        return(val);
    } else {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseCharRef: invalid xmlChar value %d\n",
	                  val);
    }
    return(0);
}